

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.c
# Opt level: O3

Raw AllocateObject(Heap *heap,Size userSize)

{
  Chuck *chuck;
  ChuckLayout **ppCVar1;
  ulong size;
  
  size = userSize + 0xb & 0xfffffffffffffff8;
  chuck = FindSmallestFitInHeap(heap,size);
  if (chuck == (Chuck *)0x0) {
    ppCVar1 = (ChuckLayout **)0x0;
  }
  else {
    if (((&chuck->field_0x4)[(ulong)(*(uint *)&chuck->field_0x4 >> 1) * 8] & 1) != 0) {
      __assert_fail("!GetUsed(selected)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/Heap.c"
                    ,0x35,"Raw AllocateObject(Heap *, Size)");
    }
    AllocateInChuck(heap,chuck,size);
    *(uint *)(&chuck->field_0x4 + (ulong)(*(uint *)&chuck->field_0x4 >> 1) * 8) =
         *(uint *)(&chuck->field_0x4 + (ulong)(*(uint *)&chuck->field_0x4 >> 1) * 8) | 1;
    ppCVar1 = &chuck->prev;
  }
  return ppCVar1;
}

Assistant:

Raw AllocateObject(Heap *heap, Size userSize) {
    Size size = (userSize + OVERHEAD_OF_USED_CHUCK + 0x07) >> 3u << 3u;
    Chuck *selected = FindSmallestFitInHeap(heap, size);
    if (!selected) {
        return NULL;
    }

    assert(!GetUsed(selected));
    AllocateInChuck(heap, selected, size);
    SetUsed(selected, 1);
    return ToObject(selected);
}